

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

int cfl_pick_plane_parameter
              (AV1_COMP *cpi,MACROBLOCK *x,int plane,TX_SIZE tx_size,int cfl_search_range)

{
  int iVar1;
  int iVar2;
  int64_t iVar3;
  TX_SIZE in_CL;
  int in_EDX;
  MACROBLOCK *in_RSI;
  AV1_COMP *in_RDI;
  int in_R8D;
  int unaff_retaddr;
  RD_STATS *in_stack_00000008;
  int64_t cfl_cost;
  int cfl_idx;
  int i;
  int dir;
  int si;
  int64_t best_cfl_cost;
  int start_cfl_idx;
  int fast_mode;
  int est_best_cfl_idx;
  BLOCK_SIZE plane_bsize;
  MACROBLOCKD_PLANE *pd;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int local_64;
  int local_5c;
  int64_t local_58;
  int local_48;
  BLOCK_SIZE in_stack_ffffffffffffffe2;
  int local_4;
  
  if (in_R8D == 0x21) {
    local_4 = 0x10;
  }
  else {
    get_plane_block_size
              ((*(in_RSI->e_mbd).mi)->bsize,(in_RSI->e_mbd).plane[in_EDX].subsampling_x,
               (in_RSI->e_mbd).plane[in_EDX].subsampling_y);
    local_48 = 0x10;
    local_58 = cfl_compute_rd(in_RDI,in_RSI,in_EDX,in_CL,in_stack_ffffffffffffffe2,in_R8D,
                              unaff_retaddr,in_stack_00000008);
    for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
      iVar1 = cfl_dir_ls[local_5c];
      local_64 = 1;
      while ((((local_64 < 0x21 && (iVar2 = iVar1 * local_64 + 0x10, -1 < iVar2)) && (iVar2 < 0x21))
             && (iVar3 = cfl_compute_rd(in_RDI,in_RSI,in_EDX,in_CL,in_stack_ffffffffffffffe2,in_R8D,
                                        unaff_retaddr,in_stack_00000008), iVar3 < local_58))) {
        local_64 = local_64 + 1;
        local_58 = iVar3;
        local_48 = iVar2;
      }
    }
    local_4 = local_48;
  }
  return local_4;
}

Assistant:

static int cfl_pick_plane_parameter(const AV1_COMP *const cpi, MACROBLOCK *x,
                                    int plane, TX_SIZE tx_size,
                                    int cfl_search_range) {
  assert(cfl_search_range >= 1 && cfl_search_range <= CFL_MAGS_SIZE);

  if (cfl_search_range == CFL_MAGS_SIZE) return CFL_INDEX_ZERO;

  const MACROBLOCKD *const xd = &x->e_mbd;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(mbmi->uv_mode == UV_CFL_PRED);
  const MACROBLOCKD_PLANE *pd = &xd->plane[plane];
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(mbmi->bsize, pd->subsampling_x, pd->subsampling_y);

  int est_best_cfl_idx = CFL_INDEX_ZERO;
  int fast_mode = 1;
  int start_cfl_idx = CFL_INDEX_ZERO;
  int64_t best_cfl_cost = cfl_compute_rd(cpi, x, plane, tx_size, plane_bsize,
                                         start_cfl_idx, fast_mode, NULL);
  for (int si = 0; si < 2; ++si) {
    const int dir = cfl_dir_ls[si];
    for (int i = 1; i < CFL_MAGS_SIZE; ++i) {
      int cfl_idx = start_cfl_idx + dir * i;
      if (cfl_idx < 0 || cfl_idx >= CFL_MAGS_SIZE) break;
      int64_t cfl_cost = cfl_compute_rd(cpi, x, plane, tx_size, plane_bsize,
                                        cfl_idx, fast_mode, NULL);
      if (cfl_cost < best_cfl_cost) {
        best_cfl_cost = cfl_cost;
        est_best_cfl_idx = cfl_idx;
      } else {
        break;
      }
    }
  }
  return est_best_cfl_idx;
}